

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp3_qpack.c
# Opt level: O0

void nghttp3_qpack_encoder_ack_everything(nghttp3_qpack_encoder *encoder)

{
  long in_RDI;
  void *in_stack_00000018;
  _func_int_void_ptr_void_ptr *in_stack_00000020;
  nghttp3_map *in_stack_00000028;
  
  *(undefined8 *)(in_RDI + 0x338) = *(undefined8 *)(in_RDI + 0x60);
  nghttp3_ksl_clear((nghttp3_ksl *)0x10dd98);
  nghttp3_pq_clear((nghttp3_pq *)(in_RDI + 0x310));
  nghttp3_map_each(in_stack_00000028,in_stack_00000020,in_stack_00000018);
  nghttp3_map_clear((nghttp3_map *)0x10ddd7);
  return;
}

Assistant:

void nghttp3_qpack_encoder_ack_everything(nghttp3_qpack_encoder *encoder) {
  encoder->krcnt = encoder->ctx.next_absidx;

  nghttp3_ksl_clear(&encoder->blocked_streams);
  nghttp3_pq_clear(&encoder->min_cnts);
  nghttp3_map_each(&encoder->streams, map_stream_free,
                   (void *)encoder->ctx.mem);
  nghttp3_map_clear(&encoder->streams);
}